

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GetUInt32(char *z,u32 *pI)

{
  int local_2c;
  ulong uStack_28;
  int i;
  u64 v;
  u32 *pI_local;
  char *z_local;
  
  uStack_28 = 0;
  local_2c = 0;
  while( true ) {
    if ((""[(byte)z[local_2c]] & 4) == 0) {
      if ((local_2c == 0) || (z[local_2c] != '\0')) {
        *pI = 0;
        z_local._4_4_ = 0;
      }
      else {
        *pI = (u32)uStack_28;
        z_local._4_4_ = 1;
      }
      return z_local._4_4_;
    }
    uStack_28 = (uStack_28 * 10 + (long)z[local_2c]) - 0x30;
    if (0x100000000 < uStack_28) break;
    local_2c = local_2c + 1;
  }
  *pI = 0;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetUInt32(const char *z, u32 *pI){
  u64 v = 0;
  int i;
  for(i=0; sqlite3Isdigit(z[i]); i++){
    v = v*10 + z[i] - '0';
    if( v>4294967296LL ){ *pI = 0; return 0; }
  }
  if( i==0 || z[i]!=0 ){ *pI = 0; return 0; }
  *pI = (u32)v;
  return 1;
}